

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.cpp
# Opt level: O2

void __thiscall SerialTaskRunner::flush(SerialTaskRunner *this)

{
  _List_node_base *p_Var1;
  bool bVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock11;
  unique_lock<std::mutex> uStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CScheduler::AreThreadsServicingQueue(this->m_scheduler);
  if (bVar2) {
    __assert_fail("!m_scheduler.AreThreadsServicingQueue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/scheduler.cpp"
                  ,0xbb,"virtual void SerialTaskRunner::flush()");
  }
  do {
    ProcessQueue(this);
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&uStack_48,&this->m_callbacks_mutex,
               "m_callbacks_mutex",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/scheduler.cpp"
               ,0xbf,false);
    p_Var1 = (this->m_callbacks_pending).
             super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    std::unique_lock<std::mutex>::~unique_lock(&uStack_48);
  } while (p_Var1 != (_List_node_base *)&this->m_callbacks_pending);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerialTaskRunner::flush()
{
    assert(!m_scheduler.AreThreadsServicingQueue());
    bool should_continue = true;
    while (should_continue) {
        ProcessQueue();
        LOCK(m_callbacks_mutex);
        should_continue = !m_callbacks_pending.empty();
    }
}